

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuiScope.cpp
# Opt level: O0

void __thiscall GuiScope::paint(GuiScope *this)

{
  bool bVar1;
  reference __in;
  type *ptVar2;
  char *label;
  type *v;
  type *name;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
  local_28;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>_>
  *__range2;
  GuiScope *this_local;
  
  bVar1 = ImGui::Begin("Uniforms",(bool *)0x0,0);
  if (bVar1) {
    __end2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>_>
             ::begin(&this->vars_);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>_>_>
         ::end(&this->vars_);
    while (bVar1 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_true>
                              ,&local_28), bVar1) {
      __in = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_false,_true>
             ::operator*(&__end2);
      std::get<0ul,std::__cxx11::string_const,GuiScope::Variable>(__in);
      ptVar2 = std::get<1ul,std::__cxx11::string_const,GuiScope::Variable>(__in);
      label = (char *)std::__cxx11::string::c_str();
      ImGui::DragScalarN(label,8,&ptVar2->value,ptVar2->components,0.01,(void *)0x0,(void *)0x0,
                         (char *)0x0,1.0);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GuiScope::Variable>,_false,_true>
      ::operator++(&__end2);
    }
  }
  ImGui::End();
  return;
}

Assistant:

void GuiScope::paint() {
	if (ImGui::Begin("Uniforms")) {
		for(auto &[name, v]: vars_) {
			//MSG("%s -> %d", name.c_str(), v.components);
			//ImGui::LabelText("", "%s", name.c_str());
			ImGui::DragScalarN(name.c_str(), ImGuiDataType_Float, &v.value.x, v.components, .01f);
		}
	}

	ImGui::End();
}